

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O1

int __thiscall jbcoin::SerialIter::getVLDataLength(SerialIter *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  
  bVar1 = get8(this);
  iVar4 = Serializer::decodeLengthLength((uint)bVar1);
  if (iVar4 == 2) {
    bVar2 = get8(this);
    iVar4 = Serializer::decodeVLLength((uint)bVar1,(uint)bVar2);
    return iVar4;
  }
  if (iVar4 == 1) {
    iVar4 = Serializer::decodeVLLength((uint)bVar1);
    return iVar4;
  }
  bVar2 = get8(this);
  bVar3 = get8(this);
  iVar4 = Serializer::decodeVLLength((uint)bVar1,(uint)bVar2,(uint)bVar3);
  return iVar4;
}

Assistant:

int SerialIter::getVLDataLength ()
{
    int b1 = get8();
    int datLen;
    int lenLen = Serializer::decodeLengthLength(b1);
    if (lenLen == 1)
    {
        datLen = Serializer::decodeVLLength (b1);
    }
    else if (lenLen == 2)
    {
        int b2 = get8();
        datLen = Serializer::decodeVLLength (b1, b2);
    }
    else
    {
        assert(lenLen == 3);
        int b2 = get8();
        int b3 = get8();
        datLen = Serializer::decodeVLLength (b1, b2, b3);
    }
    return datLen;
}